

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O2

void disruptor::test::SleepingStrategy::SignalTimeoutWaitingOnCursor_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  basic_wrap_stringstream<char> local_410;
  pointer local_278;
  pointer local_270;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  pointer local_250;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  SignalTimeoutWaitingOnCursor t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_418 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"SignalTimeoutWaitingOnCursor");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_238 = (pbVar2->_M_dataplus)._M_p;
  local_230 = local_238 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_420,0x108);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.cursor.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_1.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_2.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_3.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.alerted._M_base._M_i = (__atomic_base<bool>)false;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_428 = "";
  memset(&local_410,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_410);
  std::operator<<((ostream *)&local_410,'\"');
  std::operator<<((ostream *)&local_410,"SignalTimeoutWaitingOnCursor");
  std::operator<<((ostream *)&local_410,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_410);
  local_248 = (pbVar2->_M_dataplus)._M_p;
  local_240 = local_248 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_430,0x108);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_410);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_438 = "";
  memset(&local_410,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_410);
  std::operator<<((ostream *)&local_410,'\"');
  std::operator<<((ostream *)&local_410,"SignalTimeoutWaitingOnCursor");
  std::operator<<((ostream *)&local_410,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_410);
  local_258 = (pbVar2->_M_dataplus)._M_p;
  local_250 = local_258 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x108);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_410);
  SignalTimeoutWaitingOnCursor::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_448 = "";
  memset(&local_410,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_410);
  std::operator<<((ostream *)&local_410,'\"');
  std::operator<<((ostream *)&local_410,"SignalTimeoutWaitingOnCursor");
  std::operator<<((ostream *)&local_410,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_410);
  local_268 = (pbVar2->_M_dataplus)._M_p;
  local_260 = local_268 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x108);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_410);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_458 = "";
  memset(&local_410,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_410);
  std::operator<<((ostream *)&local_410,'\"');
  std::operator<<((ostream *)&local_410,"SignalTimeoutWaitingOnCursor");
  std::operator<<((ostream *)&local_410,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_410);
  local_278 = (pbVar2->_M_dataplus)._M_p;
  local_270 = local_278 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_460,0x108);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_410);
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}